

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnetworkinterface_p.h
# Opt level: O0

void QNetworkInterfacePrivate::calculateDnsEligibility
               (QNetworkAddressEntry *entry,bool isTemporary,bool isDeprecated)

{
  long lVar1;
  byte bVar2;
  AddressClassification AVar3;
  byte bVar4;
  byte in_DL;
  byte in_SIL;
  QNetworkAddressEntry *in_RDI;
  long in_FS_OFFSET;
  AddressClassification cl;
  undefined4 in_stack_ffffffffffffffdc;
  DnsEligibilityStatus status;
  undefined4 in_stack_ffffffffffffffe0;
  undefined2 in_stack_ffffffffffffffe4;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  bVar4 = in_SIL & 1;
  bVar2 = in_DL & 1;
  if ((bVar4 == 0) && (bVar2 == 0)) {
    QNetworkAddressEntry::ip(in_RDI);
    AVar3 = QHostAddressPrivate::classify((QHostAddress *)0x35fd82);
    QHostAddress::~QHostAddress((QHostAddress *)0x35fd90);
    status = (DnsEligibilityStatus)(AVar3 >> 0x18);
    if ((AVar3 == LoopbackAddress) || (AVar3 == LinkLocalAddress)) {
      QNetworkAddressEntry::setDnsEligibility
                ((QNetworkAddressEntry *)
                 CONCAT17(bVar4,CONCAT16(bVar2,CONCAT24(in_stack_ffffffffffffffe4,AVar3))),status);
    }
    else {
      QNetworkAddressEntry::setDnsEligibility
                ((QNetworkAddressEntry *)
                 CONCAT17(bVar4,CONCAT16(bVar2,CONCAT24(in_stack_ffffffffffffffe4,AVar3))),status);
    }
  }
  else {
    QNetworkAddressEntry::setDnsEligibility
              ((QNetworkAddressEntry *)
               (CONCAT17(in_SIL,CONCAT16(in_DL,CONCAT24(in_stack_ffffffffffffffe4,
                                                        in_stack_ffffffffffffffe0))) &
               0x101ffffffffffff),(DnsEligibilityStatus)((uint)in_stack_ffffffffffffffdc >> 0x18));
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

static void calculateDnsEligibility(QNetworkAddressEntry *entry, bool isTemporary,
                                        bool isDeprecated)
    {
        // this implements an algorithm that yields the same results as Windows
        // produces, for the same input (as far as I can test)
        if (isTemporary || isDeprecated) {
            entry->setDnsEligibility(QNetworkAddressEntry::DnsIneligible);
        } else {
            AddressClassification cl = QHostAddressPrivate::classify(entry->ip());
            if (cl == LoopbackAddress || cl == LinkLocalAddress)
                entry->setDnsEligibility(QNetworkAddressEntry::DnsIneligible);
            else
                entry->setDnsEligibility(QNetworkAddressEntry::DnsEligible);
        }
    }